

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

int PSolve(sunrealtype t,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  sunrealtype sVar15;
  undefined1 auVar16 [16];
  
  N_VScale(0x3ff0000000000000,r,z);
  GSIter(gamma,z,*(N_Vector *)((long)user_data + 0x9930),(WebData)user_data);
  iVar2 = *(int *)((long)user_data + 0x5c);
  uVar11 = 0;
  uVar7 = (ulong)*(uint *)((long)user_data + 0x50);
  if ((int)*(uint *)((long)user_data + 0x50) < 1) {
    uVar7 = uVar11;
  }
  lVar13 = (long)*(int *)((long)user_data + 0x48);
  uVar10 = (ulong)*(uint *)((long)user_data + 0x54);
  if ((int)*(uint *)((long)user_data + 0x54) < 1) {
    uVar10 = uVar11;
  }
  lVar8 = 0;
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    iVar3 = *(int *)((long)user_data + uVar11 * 4 + 0xd0);
    iVar6 = (int)lVar8;
    lVar8 = lVar13 * uVar7 + (long)iVar6;
    lVar14 = (long)iVar6 << 3;
    for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
      lVar9 = (long)*(int *)((long)user_data + uVar12 * 4 + 0x80) + (long)iVar3 * (long)iVar2;
      uVar4 = *(undefined8 *)((long)user_data + lVar9 * 8);
      uVar5 = *(undefined8 *)((long)user_data + lVar9 * 8 + 0x20);
      lVar9 = N_VGetArrayPointer(z);
      SUNDlsMat_denseGETRS(uVar4,lVar13,uVar5,lVar9 + lVar14);
      lVar14 = lVar14 + lVar13 * 8;
    }
  }
  auVar16 = N_VGetArrayPointer(r);
  dVar1 = *(double *)(auVar16._0_8_ + 0x4b00);
  sVar15 = doubleIntgr(z,(int)user_data,auVar16._8_8_);
  lVar13 = N_VGetArrayPointer(z);
  *(double *)(lVar13 + 0x4b00) = gamma * sVar15 + dVar1;
  return 0;
}

Assistant:

static int PSolve(sunrealtype t, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->vtemp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  /* Solve for the quadrature variable */
  N_VGetArrayPointer(z)[NEQ] = N_VGetArrayPointer(r)[NEQ] +
                               gamma * doubleIntgr(z, ISPEC, wdata);

  return (0);
}